

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

secplane_t * P_CheckSlopeWalk(AActor *actor,DVector2 *move)

{
  uint uVar1;
  int iVar2;
  sector_t *psVar3;
  sector_t *psVar4;
  long lVar5;
  double *pdVar6;
  msecnode_t *pmVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  secplane_t *psVar11;
  secplane_t *psVar12;
  long lVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  
  if (P_CheckSlopeWalk(AActor*,TVector2<double>&)::copyplane == '\0') {
    P_CheckSlopeWalk();
  }
  uVar1 = (actor->flags).Value;
  if ((uVar1 >> 9 & 1) == 0) {
    psVar3 = actor->floorsector;
    dVar8 = (actor->__Pos).X;
    dVar9 = (actor->__Pos).Y;
    psVar4 = actor->Sector;
    iVar2 = psVar4->PortalGroup;
    dVar15 = 0.0;
    dVar16 = 0.0;
    if (iVar2 != psVar3->PortalGroup) {
      dVar15 = Displacements.data.Array[psVar3->PortalGroup * Displacements.size + iVar2].pos.X;
      dVar16 = Displacements.data.Array[psVar3->PortalGroup * Displacements.size + iVar2].pos.Y;
    }
    dVar14 = ((psVar3->floorplane).normal.Y * (dVar16 + dVar9) +
             (psVar3->floorplane).D + (psVar3->floorplane).normal.X * (dVar15 + dVar8)) *
             (psVar3->floorplane).negiC;
    psVar11 = &psVar3->floorplane;
    uVar10 = (ulong)(psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar10 != 0) {
      lVar13 = 0;
      do {
        lVar5 = *(long *)((long)(psVar3->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                Array + lVar13);
        if ((~*(uint *)(lVar5 + 0x58) & 3) == 0) {
          pdVar6 = *(double **)(lVar5 + 0x28);
          dVar17 = *pdVar6;
          dVar20 = pdVar6[1];
          dVar18 = ((dVar16 + dVar9) * dVar20 + pdVar6[3] + (dVar15 + dVar8) * dVar17) * pdVar6[4];
          if ((dVar14 < dVar18) && (dVar18 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
            P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
            P_CheckSlopeWalk::copyplane.D = pdVar6[3];
            P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
            P_CheckSlopeWalk::copyplane.normal.X = dVar17;
            P_CheckSlopeWalk::copyplane.normal.Y = dVar20;
            if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
              P_CheckSlopeWalk::copyplane.normal.X = -dVar17;
              P_CheckSlopeWalk::copyplane.normal.Y = -dVar20;
              P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
              P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
              P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
            }
            psVar11 = &P_CheckSlopeWalk::copyplane;
            dVar14 = dVar18;
          }
        }
        lVar13 = lVar13 + 8;
      } while (uVar10 << 3 != lVar13);
    }
    psVar12 = psVar11;
    if (psVar3 != psVar4) {
      uVar10 = (ulong)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
      if (uVar10 != 0) {
        lVar13 = 0;
        do {
          lVar5 = *(long *)((long)(psVar4->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.
                                  Array + lVar13);
          if ((~*(uint *)(lVar5 + 0x58) & 3) == 0) {
            pdVar6 = *(double **)(lVar5 + 0x28);
            dVar15 = *pdVar6;
            dVar16 = pdVar6[1];
            dVar17 = (dVar9 * dVar16 + pdVar6[3] + dVar8 * dVar15) * pdVar6[4];
            if ((dVar14 < dVar17) && (dVar17 <= (actor->__Pos).Z + actor->MaxStepHeight)) {
              P_CheckSlopeWalk::copyplane.normal.Z = pdVar6[2];
              P_CheckSlopeWalk::copyplane.D = pdVar6[3];
              P_CheckSlopeWalk::copyplane.negiC = pdVar6[4];
              P_CheckSlopeWalk::copyplane.normal.X = dVar15;
              P_CheckSlopeWalk::copyplane.normal.Y = dVar16;
              if (P_CheckSlopeWalk::copyplane.normal.Z < 0.0) {
                P_CheckSlopeWalk::copyplane.normal.X = -dVar15;
                P_CheckSlopeWalk::copyplane.normal.Y = -dVar16;
                P_CheckSlopeWalk::copyplane.normal.Z = -P_CheckSlopeWalk::copyplane.normal.Z;
                P_CheckSlopeWalk::copyplane.D = -P_CheckSlopeWalk::copyplane.D;
                P_CheckSlopeWalk::copyplane.negiC = -P_CheckSlopeWalk::copyplane.negiC;
              }
              psVar11 = &P_CheckSlopeWalk::copyplane;
              dVar14 = dVar17;
            }
          }
          lVar13 = lVar13 + 8;
        } while (uVar10 << 3 != lVar13);
      }
      psVar12 = (secplane_t *)0x0;
      if (actor->floorz + 4.0 < dVar14) {
        return (secplane_t *)0x0;
      }
    }
    dVar15 = (actor->__Pos).Z;
    if (dVar15 - dVar14 <= 1.0) {
      dVar16 = (psVar11->normal).X;
      dVar17 = (psVar11->normal).Y;
      if ((((dVar16 != 0.0) || (NAN(dVar16))) || (dVar17 != 0.0)) || (NAN(dVar17))) {
        dVar18 = dVar8 + move->X;
        dVar19 = dVar9 + move->Y;
        dVar20 = (psVar11->normal).Z;
        dVar21 = dVar15 * dVar20 + dVar17 * dVar19 + dVar16 * dVar18 + psVar11->D;
        if (0.0 <= dVar21) {
          if (1.52587890625e-05 <= ABS(dVar15 - dVar14)) {
            return (secplane_t *)0x0;
          }
          if (dVar21 <= 0.0) {
            return (secplane_t *)0x0;
          }
          dVar18 = dVar18 + dVar16 * dVar21;
          dVar19 = dVar19 + dVar17 * dVar21;
        }
        else {
          if (dVar20 < 0.707122802734375) {
            if ((uVar1 >> 0xc & 1) != 0) {
              return psVar12;
            }
            if (0.4714152018229167 < dVar20) {
              for (pmVar7 = actor->touching_sectorlist; pmVar7 != (msecnode_t *)0x0;
                  pmVar7 = pmVar7->m_tnext) {
                psVar3 = pmVar7->m_sector;
                if (0.707122802734375 <= (psVar3->floorplane).normal.Z) {
                  dVar14 = 0.0;
                  dVar20 = 0.0;
                  if (iVar2 != psVar3->PortalGroup) {
                    dVar14 = Displacements.data.Array
                             [psVar3->PortalGroup * Displacements.size + iVar2].pos.X;
                    dVar20 = Displacements.data.Array
                             [psVar3->PortalGroup * Displacements.size + iVar2].pos.Y;
                  }
                  if (dVar15 - actor->MaxStepHeight <=
                      ((psVar3->floorplane).normal.Y * (dVar20 + dVar9 + move->Y) +
                      (psVar3->floorplane).D +
                      (psVar3->floorplane).normal.X * (dVar14 + dVar8 + move->X)) *
                      (psVar3->floorplane).negiC) {
                    return psVar12;
                  }
                }
              }
            }
            move->X = dVar16 + dVar16;
            move->Y = dVar17 + dVar17;
            (actor->Vel).X = dVar16 + dVar16;
            (actor->Vel).Y = dVar17 + dVar17;
            return psVar12;
          }
          dVar18 = dVar18 - dVar16 * dVar21;
          dVar19 = dVar19 - dVar17 * dVar21;
        }
        move->X = dVar18 - dVar8;
        move->Y = dVar19 - dVar9;
        return psVar12;
      }
    }
  }
  return (secplane_t *)0x0;
}

Assistant:

const secplane_t * P_CheckSlopeWalk(AActor *actor, DVector2 &move)
{
	static secplane_t copyplane;
	if (actor->flags & MF_NOGRAVITY)
	{
		return NULL;
	}

	DVector3 pos = actor->PosRelative(actor->floorsector);
	const secplane_t *plane = &actor->floorsector->floorplane;
	double planezhere = plane->ZatPoint(pos);

	for (auto rover : actor->floorsector->e->XFloor.ffloors)
	{
		if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

		double thisplanez = rover->top.plane->ZatPoint(pos);

		if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
		{
			copyplane = *rover->top.plane;
			if (copyplane.fC() < 0) copyplane.FlipVert();
			plane = &copyplane;
			planezhere = thisplanez;
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		for (auto rover : actor->Sector->e->XFloor.ffloors)
		{
			if (!(rover->flags & FF_SOLID) || !(rover->flags & FF_EXISTS)) continue;

			double thisplanez = rover->top.plane->ZatPoint(actor);

			if (thisplanez > planezhere && thisplanez <= actor->Z() + actor->MaxStepHeight)
			{
				copyplane = *rover->top.plane;
				if (copyplane.fC() < 0) copyplane.FlipVert();
				plane = &copyplane;
				planezhere = thisplanez;
			}
		}
	}

	if (actor->floorsector != actor->Sector)
	{
		// this additional check prevents sliding on sloped dropoffs
		if (planezhere>actor->floorz + 4)
			return NULL;
	}

	if (actor->Z() - planezhere > 1)
	{ // not on floor
		return NULL;
	}

	if (plane->isSlope())
	{
		DVector2 dest;
		double t;

		dest = actor->Pos() + move;
		t = (plane->Normal() | DVector3(dest, actor->Z())) + plane->fD();
		if (t < 0)
		{ // Desired location is behind (below) the plane
			// (i.e. Walking up the plane)
			if (plane->fC() < STEEPSLOPE)
			{ // Can't climb up slopes of ~45 degrees or more
				if (actor->flags & MF_NOCLIP)
				{
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
				else
				{
					const msecnode_t *node;
					bool dopush = true;

					if (plane->fC() > STEEPSLOPE * 2 / 3)
					{
						for (node = actor->touching_sectorlist; node; node = node->m_tnext)
						{
							sector_t *sec = node->m_sector;
							if (sec->floorplane.fC() >= STEEPSLOPE)
							{
								DVector3 pos = actor->PosRelative(sec) +move;

								if (sec->floorplane.ZatPoint(pos) >= actor->Z() - actor->MaxStepHeight)
								{
									dopush = false;
									break;
								}
							}
						}
					}
					if (dopush)
					{
						move = plane->Normal() * 2;
						actor->Vel.X = move.X;
						actor->Vel.Y = move.Y;
					}
					return (actor->floorsector == actor->Sector) ? plane : NULL;
				}
			}
			// Slide the desired location along the plane's normal
			// so that it lies on the plane's surface
			dest -= plane->Normal() * t;
			move = dest - actor->Pos().XY();
			return (actor->floorsector == actor->Sector) ? plane : NULL;
		}
		else if (t > 0)
		{ // Desired location is in front of (above) the plane
			if (actor->isAtZ(planezhere))	// it is very important not to be too precise here.
			{ 
				// Actor's current spot is on/in the plane, so walk down it
				// Same principle as walking up, except reversed
				dest += plane->Normal() * t;
				move = dest - actor->Pos().XY();
				return (actor->floorsector == actor->Sector) ? plane : NULL;
			}
		}
	}
	return NULL;
}